

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

time_t mg_parse_date_string(char *datetime)

{
  int iVar1;
  int iVar2;
  long local_60;
  time_t result;
  int days;
  int leap_days;
  int year;
  int month;
  int day;
  int hour;
  int minute;
  int second;
  char month_str [32];
  char *datetime_local;
  
  local_60 = 0;
  iVar1 = __isoc99_sscanf(datetime,"%d/%3s/%d %d:%d:%d",&year,&minute,&days,&month,&day,&hour);
  if ((((iVar1 != 6) &&
       (iVar1 = __isoc99_sscanf(datetime,"%d %3s %d %d:%d:%d",&year,&minute,&days,&month,&day,&hour)
       , iVar1 != 6)) &&
      (iVar1 = __isoc99_sscanf(datetime,"%*3s, %d %3s %d %d:%d:%d",&year,&minute,&days,&month,&day,
                               &hour), iVar1 != 6)) &&
     (iVar1 = __isoc99_sscanf(datetime,"%d-%3s-%d %d:%d:%d",&year,&minute,&days,&month,&day,&hour),
     iVar1 != 6)) {
    return 0;
  }
  if ((0x7b2 < days) && (leap_days = mg_get_month_index((char *)&minute), leap_days != -1)) {
    iVar1 = mg_num_leap_years(days);
    iVar2 = mg_num_leap_years(0x7b2);
    local_60 = (long)(int)(((days + -0x7b2) * 0x16d +
                            (uint)mg_parse_date_string::days_before_month[leap_days] + year + -1 +
                           (iVar1 - iVar2)) * 0x15180 + month * 0xe10 + day * 0x3c + hour);
  }
  return local_60;
}

Assistant:

MG_INTERNAL time_t mg_parse_date_string(const char *datetime) {
    static const unsigned short days_before_month[] = {
            0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334};
    char month_str[32];
    int second, minute, hour, day, month, year, leap_days, days;
    time_t result = (time_t) 0;

    if (((sscanf(datetime, "%d/%3s/%d %d:%d:%d", &day, month_str, &year, &hour,
                 &minute, &second) == 6) ||
         (sscanf(datetime, "%d %3s %d %d:%d:%d", &day, month_str, &year, &hour,
                 &minute, &second) == 6) ||
         (sscanf(datetime, "%*3s, %d %3s %d %d:%d:%d", &day, month_str, &year,
                 &hour, &minute, &second) == 6) ||
         (sscanf(datetime, "%d-%3s-%d %d:%d:%d", &day, month_str, &year, &hour,
                 &minute, &second) == 6)) &&
        year > 1970 && (month = mg_get_month_index(month_str)) != -1) {
        leap_days = mg_num_leap_years(year) - mg_num_leap_years(1970);
        year -= 1970;
        days = year * 365 + days_before_month[month] + (day - 1) + leap_days;
        result = days * 24 * 3600 + hour * 3600 + minute * 60 + second;
    }

    return result;
}